

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::block_code
          (SystemVerilogCodeGen *this,string *syntax_name,StmtBlock *stmt)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  uint64_t i;
  ulong uVar5;
  string_view sVar6;
  string local_50;
  
  if ((stmt->super_Stmt).super_IRNode.comment._M_string_length != 0) {
    sVar6 = indent(this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&(this->stream_).super_stringstream.field_0x10,sVar6._M_str,
                        sVar6._M_len);
    poVar4 = std::operator<<(poVar4,"// ");
    strip_newline(&local_50,&(stmt->super_Stmt).super_IRNode.comment);
    poVar4 = std::operator<<(poVar4,(string *)&local_50);
    puVar1 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (this->generator_->debug == true) {
    (stmt->super_Stmt).super_IRNode.verilog_ln =
         *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
  }
  puVar1 = &(this->stream_).super_stringstream.field_0x10;
  poVar4 = std::operator<<((ostream *)puVar1,(string *)syntax_name);
  poVar4 = std::operator<<(poVar4," begin");
  block_label_abi_cxx11_(&local_50,this,stmt);
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string((string *)&local_50);
  this->indent_ = this->indent_ + 1;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(stmt->stmts_).
                            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(stmt->stmts_).
                            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar5 = uVar5 + 1) {
    iVar3 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[2])(stmt,uVar5);
    (**this->_vptr_SystemVerilogCodeGen)(this,CONCAT44(extraout_var,iVar3));
  }
  this->indent_ = this->indent_ - 1;
  sVar6 = indent(this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar6._M_str,sVar6._M_len);
  poVar4 = std::operator<<(poVar4,"end");
  block_label_abi_cxx11_(&local_50,this,stmt);
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  puVar1 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void SystemVerilogCodeGen::block_code(const std::string& syntax_name, kratos::StmtBlock* stmt) {
    // comment
    if (!stmt->comment.empty()) {
        stream_ << indent() << "// " << strip_newline(stmt->comment) << stream_.endl();
    }
    if (generator_->debug) {
        stmt->verilog_ln = stream_.line_no();
    }
    stream_ << syntax_name << " begin" << block_label(stmt) << stream_.endl();
    indent_++;

    for (uint64_t i = 0; i < stmt->size(); i++) {
        dispatch_node(stmt->get_child(i));
    }

    indent_--;
    stream_ << indent() << "end" << block_label(stmt) << stream_.endl();
}